

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O3

int ly_register_types(lytype_plugin_list *plugin,char *log_name)

{
  undefined8 *puVar1;
  char *pcVar2;
  lytype_store_clb p_Var3;
  uint16_t uVar4;
  int iVar5;
  lytype_plugin_list *plVar6;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  char *__s1;
  char *pcVar11;
  lytype_plugin_list *local_38;
  
  plVar6 = type_plugins;
  uVar4 = type_plugins_count;
  pcVar11 = plugin->name;
  uVar9 = (uint)type_plugins_count;
  if (pcVar11 == (char *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    local_38 = plugin;
    do {
      if (uVar4 != 0) {
        lVar10 = 0;
        do {
          iVar5 = strcmp(pcVar11,*(char **)((long)&plVar6->name + lVar10));
          if (iVar5 == 0) {
            pcVar2 = local_38->module;
            iVar5 = strcmp(pcVar2,*(char **)((long)&plVar6->module + lVar10));
            if (iVar5 == 0) {
              __s1 = local_38->revision;
              if (__s1 == (char *)0x0) {
                __s1 = "";
                pcVar8 = "";
LAB_0016fc4c:
                ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,
                       "Processing \"%s\" extension plugin failed,implementation collision for extension %s from module %s%s%s."
                       ,log_name,pcVar11,pcVar2,pcVar8,__s1);
                return 1;
              }
              pcVar8 = *(char **)((long)&plVar6->revision + lVar10);
              if ((pcVar8 == (char *)0x0) || (iVar5 = strcmp(__s1,pcVar8), iVar5 == 0)) {
                pcVar8 = "@";
                goto LAB_0016fc4c;
              }
            }
          }
          lVar10 = lVar10 + 0x28;
        } while ((ulong)(uVar9 * 8) * 5 != lVar10);
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      local_38 = plugin + uVar7;
      pcVar11 = local_38->name;
    } while (pcVar11 != (char *)0x0);
  }
  plVar6 = (lytype_plugin_list *)realloc(plVar6,(ulong)(uVar9 + (int)uVar7) * 0x28);
  if (plVar6 == (lytype_plugin_list *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_register_types");
    iVar5 = -1;
  }
  else {
    iVar5 = 0;
    type_plugins = plVar6;
    if ((int)uVar7 != 0) {
      lVar10 = uVar7 * 0x28;
      do {
        uVar7 = (ulong)uVar9 & 0xffff;
        plVar6[uVar7].free_clb = *(_func_void_void_ptr **)((long)plugin + lVar10 + -8);
        puVar1 = (undefined8 *)((long)&plugin[-1].module + lVar10);
        pcVar11 = (char *)*puVar1;
        pcVar2 = (char *)puVar1[1];
        puVar1 = (undefined8 *)((long)plugin + lVar10 + -0x18);
        p_Var3 = (lytype_store_clb)puVar1[1];
        plVar6[uVar7].name = (char *)*puVar1;
        (&plVar6[uVar7].name)[1] = (char *)p_Var3;
        plVar6[uVar7].module = pcVar11;
        plVar6[uVar7].revision = pcVar2;
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + -0x28;
      } while (lVar10 != 0);
      type_plugins_count = (uint16_t)uVar9;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

API int
ly_register_types(struct lytype_plugin_list *plugin, const char *log_name)
{
    struct lytype_plugin_list *p;
    uint32_t u, v;

    for (u = 0; plugin[u].name; u++) {
        /* check user type implementations for collisions */
        for (v = 0; v < type_plugins_count; v++) {
            if (!strcmp(plugin[u].name, type_plugins[v].name) &&
                    !strcmp(plugin[u].module, type_plugins[v].module) &&
                    (!plugin[u].revision || !type_plugins[v].revision || !strcmp(plugin[u].revision, type_plugins[v].revision))) {
                LOGERR(NULL, LY_ESYS, "Processing \"%s\" extension plugin failed,"
                        "implementation collision for extension %s from module %s%s%s.",
                        log_name, plugin[u].name, plugin[u].module, plugin[u].revision ? "@" : "",
                        plugin[u].revision ? plugin[u].revision : "");
                return 1;
            }
        }
    }

    /* add the new plugins, we have number of new plugins as u */
    p = realloc(type_plugins, (type_plugins_count + u) * sizeof *type_plugins);
    if (!p) {
        LOGMEM(NULL);
        return -1;
    }
    type_plugins = p;
    for (; u; u--) {
        memcpy(&type_plugins[type_plugins_count], &plugin[u - 1], sizeof *plugin);
        type_plugins_count++;
    }

    return 0;
}